

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  test_simple();
  test_error();
  test_record();
  test_no_ascii();
  test_copy();
  test_encode_char();
  puts("DONE.");
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  test_simple();
  test_error();
  test_record();
  test_no_ascii();
  test_copy();
  test_encode_char();
  printf("DONE.\n");
  return 0;
}